

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  string local_38 [32];
  ostream *local_18;
  ostream *os_local;
  ExpectationBase *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  pcVar1 = file(this);
  line(this);
  testing::internal::FormatFileLocation_abi_cxx11_((char *)local_38,(int)pcVar1);
  poVar2 = std::operator<<(os,local_38);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }